

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O3

int __thiscall
booster::aio::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 uVar1;
  int iVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  undefined1 local_30 [16];
  
  local_30._0_4_ = 0;
  local_30._8_8_ = std::_V2::system_category();
  iVar2 = accept(this,__fd,(sockaddr *)local_30,__addr_len);
  uVar1 = local_30._0_4_;
  if (local_30._0_4_ == 0) {
    return iVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = uVar1;
  eVar3._M_cat = (error_category *)local_30._8_8_;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void acceptor::accept(stream_socket &target)
{
	system::error_code e;
	accept(target,e);
	if(e)
		throw system::system_error(e);
}